

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_job_queue_post(ma_job_queue *pQueue,ma_job *pJob)

{
  ma_uint64 *pmVar1;
  ulong uVar2;
  anon_union_8_2_cf9b0fbd_for_toc aVar3;
  ma_result mVar4;
  ulong uVar5;
  long lVar6;
  ma_job *pmVar7;
  ma_job *pmVar8;
  bool bVar9;
  byte bVar10;
  ma_uint64 slot;
  
  bVar10 = 0;
  if (pJob == (ma_job *)0x0 || pQueue == (ma_job_queue *)0x0) {
    mVar4 = MA_INVALID_ARGS;
  }
  else {
    mVar4 = ma_slot_allocator_alloc(&pQueue->allocator,&slot);
    if (mVar4 == MA_SUCCESS) {
      aVar3.breakup.refcount = slot._4_4_;
      aVar3.allocation._0_4_ = CONCAT22(slot._2_2_,(ushort)slot);
      if (pQueue->capacity <= (uint)(ushort)slot) {
        __assert_fail("ma_job_extract_slot(slot) < pQueue->capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                      ,0x4508,"ma_result ma_job_queue_post(ma_job_queue *, const ma_job *)");
      }
      uVar5 = (ulong)CONCAT22(slot._2_2_,(ushort)slot) & 0xffff;
      pmVar7 = pJob;
      pmVar8 = pQueue->pJobs + uVar5;
      for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
        pmVar8->toc = pmVar7->toc;
        pmVar7 = (ma_job *)((long)pmVar7 + (ulong)bVar10 * -0x10 + 8);
        pmVar8 = (ma_job *)((long)pmVar8 + (ulong)bVar10 * -0x10 + 8);
      }
      pQueue->pJobs[uVar5].toc = aVar3;
      pQueue->pJobs[(ushort)slot].toc.breakup.code = (pJob->toc).breakup.code;
      pQueue->pJobs[(ushort)slot].next = 0xffffffffffffffff;
      ma_spinlock_lock(&pQueue->lock);
      do {
        while( true ) {
          do {
            uVar5 = pQueue->tail;
            uVar2 = pQueue->pJobs[uVar5 & 0xffff].next;
          } while (((pQueue->tail ^ uVar5) & 0xffffffff0000ffff) != 0);
          if ((uVar2 & 0xffff) == 0xffff) break;
          LOCK();
          if (uVar5 == pQueue->tail) {
            pQueue->tail = uVar2 & 0xffff | (uVar5 & 0xffffffff00000000) + 0x100000000;
          }
          UNLOCK();
        }
        pmVar1 = &pQueue->pJobs[uVar5 & 0xffff].next;
        LOCK();
        bVar9 = uVar2 == *pmVar1;
        if (bVar9) {
          *pmVar1 = (uVar2 & 0xffffffff00000000) + 0x100000000 |
                    (ulong)CONCAT22(slot._2_2_,(ushort)slot);
        }
        UNLOCK();
      } while (!bVar9);
      LOCK();
      if (uVar5 == pQueue->tail) {
        pQueue->tail = (uVar5 & 0xffffffff00000000) + 0x100000000 |
                       (ulong)CONCAT22(slot._2_2_,(ushort)slot);
      }
      UNLOCK();
      pQueue->lock = 0;
      mVar4 = MA_SUCCESS;
      if ((pQueue->flags & 1) == 0) {
        ma_semaphore_release(&pQueue->sem);
      }
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_job_queue_post(ma_job_queue* pQueue, const ma_job* pJob)
{
    /*
    Lock free queue implementation based on the paper by Michael and Scott: Nonblocking Algorithms and Preemption-Safe Locking on Multiprogrammed Shared Memory Multiprocessors
    */
    ma_result result;
    ma_uint64 slot;
    ma_uint64 tail;
    ma_uint64 next;

    if (pQueue == NULL || pJob == NULL) {
        return MA_INVALID_ARGS;
    }

    /* We need a new slot. */
    result = ma_slot_allocator_alloc(&pQueue->allocator, &slot);
    if (result != MA_SUCCESS) {
        return result;  /* Probably ran out of slots. If so, MA_OUT_OF_MEMORY will be returned. */
    }

    /* At this point we should have a slot to place the job. */
    MA_ASSERT(ma_job_extract_slot(slot) < pQueue->capacity);

    /* We need to put the job into memory before we do anything. */
    pQueue->pJobs[ma_job_extract_slot(slot)]                  = *pJob;
    pQueue->pJobs[ma_job_extract_slot(slot)].toc.allocation   = slot;                    /* This will overwrite the job code. */
    pQueue->pJobs[ma_job_extract_slot(slot)].toc.breakup.code = pJob->toc.breakup.code;  /* The job code needs to be applied again because the line above overwrote it. */
    pQueue->pJobs[ma_job_extract_slot(slot)].next             = MA_JOB_ID_NONE;          /* Reset for safety. */

    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_lock(&pQueue->lock);
    #endif
    {
        /* The job is stored in memory so now we need to add it to our linked list. We only ever add items to the end of the list. */
        for (;;) {
            tail = ma_atomic_load_64(&pQueue->tail);
            next = ma_atomic_load_64(&pQueue->pJobs[ma_job_extract_slot(tail)].next);

            if (ma_job_toc_to_allocation(tail) == ma_job_toc_to_allocation(ma_atomic_load_64(&pQueue->tail))) {
                if (ma_job_extract_slot(next) == 0xFFFF) {
                    if (ma_job_queue_cas(&pQueue->pJobs[ma_job_extract_slot(tail)].next, next, slot)) {
                        break;
                    }
                } else {
                    ma_job_queue_cas(&pQueue->tail, tail, ma_job_extract_slot(next));
                }
            }
        }
        ma_job_queue_cas(&pQueue->tail, tail, slot);
    }
    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_unlock(&pQueue->lock);
    #endif


    /* Signal the semaphore as the last step if we're using synchronous mode. */
    if ((pQueue->flags & MA_JOB_QUEUE_FLAG_NON_BLOCKING) == 0) {
        #ifndef MA_NO_THREADING
        {
            ma_semaphore_release(&pQueue->sem);
        }
        #else
        {
            MA_ASSERT(MA_FALSE);    /* Should never get here. Should have been checked at initialization time. */
        }
        #endif
    }

    return MA_SUCCESS;
}